

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfAttribute.h
# Opt level: O1

int __thiscall
Imf_2_5::TypedAttribute<Imath_2_5::Matrix33<float>_>::copy
          (TypedAttribute<Imath_2_5::Matrix33<float>_> *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  _func_int **pp_Var1;
  _func_int **pp_Var2;
  _func_int **pp_Var3;
  Attribute *this_00;
  TypedAttribute<Imath_2_5::Matrix33<float>_> *pTVar4;
  
  this_00 = (Attribute *)operator_new(0x30);
  this_00->_vptr_Attribute = (_func_int **)0x0;
  this_00[1]._vptr_Attribute = (_func_int **)0x0;
  this_00[2]._vptr_Attribute = (_func_int **)0x0;
  this_00[3]._vptr_Attribute = (_func_int **)0x0;
  this_00[4]._vptr_Attribute = (_func_int **)0x0;
  this_00[5]._vptr_Attribute = (_func_int **)0x0;
  Attribute::Attribute(this_00);
  this_00->_vptr_Attribute = (_func_int **)&PTR__Attribute_0037fc00;
  this_00[1]._vptr_Attribute = (_func_int **)0x0;
  this_00[2]._vptr_Attribute = (_func_int **)0x0;
  this_00[3]._vptr_Attribute = (_func_int **)0x0;
  this_00[4]._vptr_Attribute = (_func_int **)0x0;
  *(undefined4 *)&this_00[1]._vptr_Attribute = 0x3f800000;
  *(undefined4 *)&this_00[3]._vptr_Attribute = 0x3f800000;
  *(undefined4 *)&this_00[5]._vptr_Attribute = 0x3f800000;
  pTVar4 = cast(&this->super_Attribute);
  pp_Var1 = *(_func_int ***)((pTVar4->_value).x[0] + 2);
  pp_Var2 = *(_func_int ***)((pTVar4->_value).x[1] + 1);
  pp_Var3 = *(_func_int ***)(pTVar4->_value).x[2];
  this_00[1]._vptr_Attribute = *(_func_int ***)(pTVar4->_value).x[0];
  this_00[2]._vptr_Attribute = pp_Var1;
  this_00[3]._vptr_Attribute = pp_Var2;
  this_00[4]._vptr_Attribute = pp_Var3;
  *(float *)&this_00[5]._vptr_Attribute = (pTVar4->_value).x[2][2];
  return (int)this_00;
}

Assistant:

Attribute *
TypedAttribute<T>::copy () const
{
    Attribute * attribute = new TypedAttribute<T>();
    attribute->copyValueFrom (*this);
    return attribute;
}